

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

Graph * __thiscall Graph::returnCopy(Graph *this)

{
  int iVar1;
  Graph *this_00;
  int idLoadFactor;
  int idLoadFactor_00;
  Vertex *pVVar2;
  Edge *pEVar3;
  double dVar4;
  double dVar5;
  
  this_00 = (Graph *)operator_new(0x88);
  Graph(this_00);
  for (pVVar2 = this->verticesList->nextVertex; pVVar2 != (Vertex *)0x0; pVVar2 = pVVar2->nextVertex
      ) {
    iVar1 = pVVar2->id;
    dVar4 = Vertex::getActivePower(pVVar2);
    dVar5 = Vertex::getReactivePower(pVVar2);
    insertVertex(this_00,iVar1,dVar4,dVar5,pVVar2->voltage,idLoadFactor);
  }
  pVVar2 = this->verticesList;
  iVar1 = pVVar2->id;
  dVar4 = Vertex::getActivePower(pVVar2);
  dVar5 = Vertex::getReactivePower(pVVar2);
  insertVertex(this_00,iVar1,dVar4,dVar5,pVVar2->voltage,idLoadFactor_00);
  for (pVVar2 = this->verticesList; pVVar2 != (Vertex *)0x0; pVVar2 = pVVar2->nextVertex) {
    for (pEVar3 = pVVar2->edgesList; pEVar3 != (Edge *)0x0; pEVar3 = pEVar3->nextEdge) {
      insertEdge(this_00,pEVar3->origin->id,pEVar3->destiny->id,pEVar3->id,pEVar3->resistance,
                 pEVar3->reactance,pEVar3->closed);
    }
  }
  return this_00;
}

Assistant:

Graph *Graph::returnCopy(){
    Graph *g = new Graph();
    int originId, destinyId, edgeId, vertexId;
    double resist, react, activePower, reactivePower, voltage;

    for(Vertex *no= this->verticesList->getNext(); no!=NULL; no= no->getNext()){
        vertexId = no->getID();
        activePower = no->getActivePower();
        reactivePower = no->getReactivePower();
        voltage = no->getVoltage();

        g->insertVertex(vertexId, activePower, reactivePower, voltage);
    }

    //inserindo no fonte por ultimo pos a funcao que insere nós insere sempre no inicio da lista, assim o nó fonte fica no inicio da lista
    Vertex *source = this->verticesList;
    g->insertVertex(source->getID(), source->getActivePower(), source->getReactivePower(), source->getVoltage());

    for(Vertex *v=this->verticesList; v!=NULL; v= v->getNext()){
         for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){
            originId = e->getOrigin()->getID();
            destinyId = e->getDestiny()->getID();
            edgeId = e->getID();
            resist = e->getResistance();
            react = e->getReactance();

             g->insertEdge(originId, destinyId, edgeId, resist, react, e->isClosed());
        }
    }
    return g;
}